

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O3

Addr deref(Machine *m,Addr a)

{
  Addr AVar1;
  bool bVar2;
  Addr a_00;
  Machine local_160;
  Machine local_f0;
  Addr local_7c;
  undefined1 local_70 [8];
  Hcell hc;
  
  hc.f_._32_8_ = a._0_8_;
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)&local_160,
             (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
              *)m);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::_Rb_tree(&local_160.regval._M_t,&(m->regval)._M_t);
  local_160.mode = m->mode;
  local_160.h.hix = (m->h).hix;
  local_160.s.hix = (m->s).hix;
  machineAtAddr((Hcell *)local_70,&local_160,a);
  std::
  _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
  ::~_Rb_tree(&local_160.regval._M_t);
  std::
  _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
  ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
               *)&local_160);
  if (local_70._0_4_ == Ref) {
    local_7c.tag_ = Heap;
    local_7c.r_.r = -0x2a;
    local_7c.hix_.hix = local_70._4_4_;
    bVar2 = Addr::operator==(&local_7c,(Addr *)&hc.f_.arity);
    if (!bVar2) {
      std::
      _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
      ::_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                  *)&local_f0,
                 (_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                  *)m);
      std::
      _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
      ::_Rb_tree(&local_f0.regval._M_t,&(m->regval)._M_t);
      local_f0.mode = m->mode;
      local_f0.h.hix = (m->h).hix;
      local_f0.s.hix = (m->s).hix;
      if (Str < (uint)local_70._0_4_) {
        __assert_fail("tag == Htag::Ref || tag == Htag::Str",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x7b,"Hix Hcell::hix() const");
      }
      a_00.hix_.hix = local_70._4_4_;
      a_00.tag_ = Heap;
      a_00.r_.r = -0x2a;
      deref(&local_f0,a_00);
      std::
      _Rb_tree<Register,_std::pair<const_Register,_Hcell>,_std::_Select1st<std::pair<const_Register,_Hcell>_>,_std::less<Register>,_std::allocator<std::pair<const_Register,_Hcell>_>_>
      ::~_Rb_tree(&local_f0.regval._M_t);
      std::
      _Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
      ::~_Rb_tree((_Rb_tree<Hix,_std::pair<const_Hix,_Hcell>,_std::_Select1st<std::pair<const_Hix,_Hcell>_>,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>
                   *)&local_f0);
    }
  }
  AVar1.hix_.hix = a.hix_.hix.hix;
  AVar1.tag_ = hc.f_.arity;
  AVar1.r_.r = hc.f_._36_4_;
  if ((size_type *)hc._0_8_ != &hc.f_.id._M_string_length) {
    operator_delete((void *)hc._0_8_,hc.f_.id._M_string_length + 1);
  }
  return AVar1;
}

Assistant:

Addr deref(Machine m, Addr a) {
    const Hcell hc = machineAtAddr(m, a);
    // if we have a reference to chase which is not pointing to itself, then
    // chase it
    if (hc.tag == Htag::Ref && Addr(hc.hix()) != a) {
        deref(m, hc.hix());
    }
    return a;
}